

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O2

void light_free_file_info(light_pcapng_file_info *info)

{
  free(info->user_app_desc);
  free(info->file_comment);
  free(info->hardware_desc);
  free(info->os_desc);
  free(info);
  return;
}

Assistant:

void light_free_file_info(light_pcapng_file_info *info)
{
	if (info->user_app_desc != NULL)
		free(info->user_app_desc);

	if (info->file_comment != NULL)
		free(info->file_comment);

	if (info->hardware_desc != NULL)
		free(info->hardware_desc);

	if (info->os_desc != NULL)
		free(info->os_desc);

	free(info);
}